

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

bool __thiscall kj::PathPtr::endsWith(PathPtr *this,PathPtr suffix)

{
  ulong uVar1;
  String *pSVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  char *__s2;
  char *__s1;
  long lVar9;
  ulong uVar10;
  
  uVar10 = suffix.parts.size_;
  uVar1 = (this->parts).size_;
  lVar6 = uVar1 - uVar10;
  if (uVar1 < uVar10) {
LAB_003425e6:
    bVar8 = false;
  }
  else {
    bVar8 = true;
    if (uVar10 != 0) {
      pSVar2 = (this->parts).ptr;
      lVar9 = 8;
      do {
        lVar3 = *(long *)((long)&((suffix.parts.ptr)->content).ptr + lVar9);
        lVar7 = lVar3 + (ulong)(lVar3 == 0);
        lVar4 = *(long *)((long)&pSVar2[lVar6].content.ptr + lVar9);
        if (lVar4 + (ulong)(lVar4 == 0) != lVar7) goto LAB_003425e6;
        __s2 = "";
        if (lVar3 != 0) {
          __s2 = *(char **)((long)suffix.parts.ptr + lVar9 + -8);
        }
        __s1 = "";
        if (lVar4 != 0) {
          __s1 = *(char **)((long)pSVar2 + lVar9 + lVar6 * 0x18 + -8);
        }
        iVar5 = bcmp(__s1,__s2,lVar7 - 1);
        if (iVar5 != 0) goto LAB_003425e6;
        lVar9 = lVar9 + 0x18;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
  }
  return bVar8;
}

Assistant:

void init(SymlinkNode&& value) {
      node.init<SymlinkNode>(kj::mv(value));
    }